

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_named_node_iterator * __thiscall
pugi::xml_named_node_iterator::operator--(xml_named_node_iterator *this)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node xVar3;
  char *src;
  xml_node local_10;
  
  if ((this->_wrap)._root == (xml_node_struct *)0x0) {
    pxVar1 = (this->_parent)._root;
    if ((pxVar1 == (xml_node_struct *)0x0) ||
       (pxVar1 = pxVar1->first_child, pxVar1 == (xml_node_struct *)0x0)) {
      xml_node::xml_node(&local_10);
    }
    else {
      xml_node::xml_node(&local_10,pxVar1->prev_sibling_c);
    }
    (this->_wrap)._root = local_10._root;
    if (local_10._root == (xml_node_struct *)0x0) {
      src = "";
    }
    else {
      src = "";
      if ((local_10._root)->name != (char_t *)0x0) {
        src = (local_10._root)->name;
      }
    }
    bVar2 = impl::anon_unknown_0::strequal(src,this->_name);
    if (bVar2) {
      return this;
    }
  }
  xVar3 = xml_node::previous_sibling(&this->_wrap,this->_name);
  (this->_wrap)._root = xVar3._root;
  return this;
}

Assistant:

PUGI__FN const xml_named_node_iterator& xml_named_node_iterator::operator--()
	{
		if (_wrap._root)
			_wrap = _wrap.previous_sibling(_name);
		else
		{
			_wrap = _parent.last_child();

			if (!impl::strequal(_wrap.name(), _name))
				_wrap = _wrap.previous_sibling(_name);
		}

		return *this;
	}